

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall piksel::Graphics::_rect(Graphics *this,float a,float b,float c,float d)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  _Elt_pointer pSVar2;
  float fVar3;
  float fVar4;
  
  push(this);
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  switch(pSVar2[-1].shaderIrrelevantState.rectMode) {
  case CENTER:
    a = a - c * 0.5;
    b = b - d * 0.5;
    goto LAB_0014bdc5;
  case CORNER:
LAB_0014bdc5:
    translate(this,a,b);
    break;
  case CORNERS:
    fVar3 = a;
    if (a <= c) {
      fVar3 = c;
      c = a;
    }
    fVar4 = b;
    if (b <= d) {
      fVar4 = d;
      d = b;
    }
    translate(this,c,d);
    c = fVar3 - c;
    d = fVar4 - d;
    break;
  case RADIUS:
    translate(this,a - c,b - d);
    c = c + c;
    d = d + d;
    break;
  default:
    goto switchD_0014bcdf_default;
  }
  scale(this,c,d);
switchD_0014bcdf_default:
  std::vector<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>::push_back
            (this->shaderRelevantStateVector,&pSVar2[-1].shaderRelevantState);
  pop(this);
  return;
}

Assistant:

void Graphics::_rect(float a, float b, float c, float d) {
    push();
    State& state = peek();
    switch(state.shaderIrrelevantState.rectMode) {
        case DrawMode::CENTER:
            translate(a - c / 2, b - d / 2);
            scale(c, d);
            break;
        case DrawMode::CORNER:
            translate(a, b);
            scale(c, d);
            break;
        case DrawMode::CORNERS:
            if (a > c) {
                std::swap(a, c);
            }
            if (b > d) {
                std::swap(b, d);
            }
            translate(a, b);
            scale(c - a, d - b);
            break;
        case DrawMode::RADIUS:
            translate(a - c, b - d);
            scale(c * 2, d * 2);
            break; 
    }
    shaderRelevantStateVector.push_back(state.shaderRelevantState);
    pop();
}